

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

int jpc_poc_putparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out)

{
  int iVar1;
  jpc_pocpchg_t *pjVar2;
  int iVar3;
  
  if (0 < (ms->parms).soc) {
    pjVar2 = (ms->parms).poc.pchgs;
    iVar3 = 0;
    do {
      iVar1 = jpc_putuint8(out,pjVar2->rlvlnostart);
      if (iVar1 != 0) {
        return -1;
      }
      if (cstate->numcomps < 0x101) {
        iVar1 = jpc_putuint8(out,(uint_fast8_t)pjVar2->compnostart);
      }
      else {
        iVar1 = jpc_putuint16(out,pjVar2->compnostart);
      }
      if (iVar1 != 0) {
        return -1;
      }
      iVar1 = jpc_putuint16(out,pjVar2->lyrnoend);
      if (iVar1 != 0) {
        return -1;
      }
      iVar1 = jpc_putuint8(out,pjVar2->rlvlnoend);
      if (iVar1 != 0) {
        return -1;
      }
      if (cstate->numcomps < 0x101) {
        iVar1 = jpc_putuint8(out,(uint_fast8_t)pjVar2->compnoend);
      }
      else {
        iVar1 = jpc_putuint16(out,pjVar2->compnoend);
      }
      if (iVar1 != 0) {
        return -1;
      }
      iVar1 = jpc_putuint8(out,pjVar2->prgord);
      if (iVar1 != 0) {
        return -1;
      }
      iVar3 = iVar3 + 1;
      pjVar2 = pjVar2 + 1;
    } while (iVar3 < (ms->parms).soc);
  }
  return 0;
}

Assistant:

static int jpc_poc_putparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *out)
{
	jpc_poc_t *poc = &ms->parms.poc;
	jpc_pocpchg_t *pchg;
	int pchgno;
	for (pchgno = 0, pchg = poc->pchgs; pchgno < poc->numpchgs; ++pchgno,
	  ++pchg) {
		if (jpc_putuint8(out, pchg->rlvlnostart) ||
		  ((cstate->numcomps > 256) ?
		  jpc_putuint16(out, pchg->compnostart) :
		  jpc_putuint8(out, pchg->compnostart)) ||
		  jpc_putuint16(out, pchg->lyrnoend) ||
		  jpc_putuint8(out, pchg->rlvlnoend) ||
		  ((cstate->numcomps > 256) ?
		  jpc_putuint16(out, pchg->compnoend) :
		  jpc_putuint8(out, pchg->compnoend)) ||
		  jpc_putuint8(out, pchg->prgord)) {
			return -1;
		}
	}
	return 0;
}